

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O2

void __thiscall Catch::SectionTracking::TestCaseTracker::leaveSection(TestCaseTracker *this)

{
  TrackedSection *pTVar1;
  
  TrackedSection::leave(this->m_currentSection);
  pTVar1 = this->m_currentSection->m_parent;
  this->m_currentSection = pTVar1;
  if (pTVar1 != (TrackedSection *)0x0) {
    this->m_completedASectionThisRun = true;
    return;
  }
  __assert_fail("m_currentSection != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/I3ck[P]LazyTrees/tests/../dependencies/Catch.h"
                ,0x1308,"void Catch::SectionTracking::TestCaseTracker::leaveSection()");
}

Assistant:

void leaveSection() {
            m_currentSection->leave();
            m_currentSection = m_currentSection->getParent();
            assert( m_currentSection != NULL );
            m_completedASectionThisRun = true;
        }